

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationRuleParser::parseResetAndPosition(CollationRuleParser *this,UErrorCode *errorCode)

{
  UBool UVar1;
  int8_t iVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined1 local_70 [8];
  UnicodeString str;
  int32_t resetStrength;
  int32_t iStack_24;
  UChar c;
  int32_t j;
  int32_t i;
  UErrorCode *errorCode_local;
  CollationRuleParser *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return -1;
  }
  iStack_24 = skipWhiteSpace(this,this->ruleIndex + 1);
  iVar2 = UnicodeString::compare
                    (this->rules,iStack_24,7,(char16_t *)(anonymous_namespace)::BEFORE,0,7);
  if (iVar2 == '\0') {
    iVar4 = UnicodeString::length(this->rules);
    if (iStack_24 + 7 < iVar4) {
      cVar3 = UnicodeString::charAt(this->rules,iStack_24 + 7);
      UVar1 = PatternProps::isWhiteSpace((uint)(ushort)cVar3);
      if (UVar1 != '\0') {
        iVar4 = skipWhiteSpace(this,iStack_24 + 8);
        iVar5 = UnicodeString::length(this->rules);
        if ((((iVar4 + 1 < iVar5) &&
             (str.fUnion.fStackFields.fBuffer[0x1a] = UnicodeString::charAt(this->rules,iVar4),
             0x30 < (ushort)str.fUnion.fStackFields.fBuffer[0x1a])) &&
            ((ushort)str.fUnion.fStackFields.fBuffer[0x1a] < 0x34)) &&
           (cVar3 = UnicodeString::charAt(this->rules,iVar4 + 1), cVar3 == L']')) {
          str.fUnion._48_4_ = (ushort)str.fUnion.fStackFields.fBuffer[0x1a] - 0x31;
          iStack_24 = skipWhiteSpace(this,iVar4 + 2);
          goto LAB_00299df7;
        }
      }
    }
  }
  str.fUnion._48_4_ = 0xf;
LAB_00299df7:
  iVar4 = UnicodeString::length(this->rules);
  if (iStack_24 < iVar4) {
    UnicodeString::UnicodeString((UnicodeString *)local_70);
    cVar3 = UnicodeString::charAt(this->rules,iStack_24);
    if (cVar3 == L'[') {
      iStack_24 = parseSpecialPosition(this,iStack_24,(UnicodeString *)local_70,errorCode);
    }
    else {
      iStack_24 = parseTailoringString(this,iStack_24,(UnicodeString *)local_70,errorCode);
    }
    (*(this->sink->super_UObject)._vptr_UObject[3])
              (this->sink,(ulong)(uint)str.fUnion._48_4_,local_70,&this->errorReason,errorCode);
    UVar1 = ::U_FAILURE(*errorCode);
    if (UVar1 != '\0') {
      setErrorContext(this);
    }
    this->ruleIndex = iStack_24;
    this_local._4_4_ = str.fUnion._48_4_;
    UnicodeString::~UnicodeString((UnicodeString *)local_70);
  }
  else {
    setParseError(this,"reset without position",errorCode);
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationRuleParser::parseResetAndPosition(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    int32_t i = skipWhiteSpace(ruleIndex + 1);
    int32_t j;
    UChar c;
    int32_t resetStrength;
    if(rules->compare(i, BEFORE_LENGTH, BEFORE, 0, BEFORE_LENGTH) == 0 &&
            (j = i + BEFORE_LENGTH) < rules->length() &&
            PatternProps::isWhiteSpace(rules->charAt(j)) &&
            ((j = skipWhiteSpace(j + 1)) + 1) < rules->length() &&
            0x31 <= (c = rules->charAt(j)) && c <= 0x33 &&
            rules->charAt(j + 1) == 0x5d) {
        // &[before n] with n=1 or 2 or 3
        resetStrength = UCOL_PRIMARY + (c - 0x31);
        i = skipWhiteSpace(j + 2);
    } else {
        resetStrength = UCOL_IDENTICAL;
    }
    if(i >= rules->length()) {
        setParseError("reset without position", errorCode);
        return UCOL_DEFAULT;
    }
    UnicodeString str;
    if(rules->charAt(i) == 0x5b) {  // '['
        i = parseSpecialPosition(i, str, errorCode);
    } else {
        i = parseTailoringString(i, str, errorCode);
    }
    sink->addReset(resetStrength, str, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
    return resetStrength;
}